

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

mraa_result_t mraa_intel_edison_pwm_init_pre(int pin)

{
  mraa_result_t mVar1;
  mraa_gpio_context p_Var2;
  mraa_gpio_context pullup_pin;
  mraa_gpio_context output_e;
  int pin_local;
  
  if (miniboard == 1) {
    output_e._4_4_ = mraa_intel_edison_pinmode_change(plat->pins[pin].gpio.pinmap,1);
  }
  else if ((pin < 0) || (0x13 < pin)) {
    output_e._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
  }
  else if ((*(byte *)&plat->pins[pin].capabilities >> 2 & 1) == 0) {
    output_e._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
  }
  else {
    p_Var2 = mraa_gpio_init_raw(outputen[pin]);
    if (p_Var2 == (mraa_gpio_context)0x0) {
      output_e._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
    }
    else {
      mVar1 = mraa_gpio_dir(p_Var2,MRAA_GPIO_OUT);
      if (mVar1 == MRAA_SUCCESS) {
        mVar1 = mraa_gpio_write(p_Var2,1);
        if (mVar1 == MRAA_SUCCESS) {
          mraa_gpio_close(p_Var2);
          p_Var2 = mraa_gpio_init_raw(pullup_map[pin]);
          if (p_Var2 == (mraa_gpio_context)0x0) {
            output_e._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
          }
          else {
            mVar1 = mraa_gpio_dir(p_Var2,MRAA_GPIO_IN);
            if (mVar1 == MRAA_SUCCESS) {
              mraa_gpio_close(p_Var2);
              mraa_intel_edison_pinmode_change(plat->pins[pin].gpio.pinmap,1);
              output_e._4_4_ = MRAA_SUCCESS;
            }
            else {
              mraa_gpio_close(p_Var2);
              output_e._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
            }
          }
        }
        else {
          mraa_gpio_close(p_Var2);
          output_e._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
        }
      }
      else {
        mraa_gpio_close(p_Var2);
        output_e._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
      }
    }
  }
  return output_e._4_4_;
}

Assistant:

mraa_result_t
mraa_intel_edison_pwm_init_pre(int pin)
{
    if (miniboard == 1) {
        return mraa_intel_edison_pinmode_change(plat->pins[pin].gpio.pinmap, 1);
    }
    if (pin < 0 || pin > 19) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    if (!plat->pins[pin].capabilities.pwm) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    mraa_gpio_context output_e;
    output_e = mraa_gpio_init_raw(outputen[pin]);
    if (output_e == NULL) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (mraa_gpio_dir(output_e, MRAA_GPIO_OUT) != MRAA_SUCCESS) {
        mraa_gpio_close(output_e);
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (mraa_gpio_write(output_e, 1) != MRAA_SUCCESS) {
        mraa_gpio_close(output_e);
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    mraa_gpio_close(output_e);

    mraa_gpio_context pullup_pin;
    pullup_pin = mraa_gpio_init_raw(pullup_map[pin]);
    if (pullup_pin == NULL) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (mraa_gpio_dir(pullup_pin, MRAA_GPIO_IN) != MRAA_SUCCESS) {
        mraa_gpio_close(pullup_pin);
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    mraa_gpio_close(pullup_pin);
    mraa_intel_edison_pinmode_change(plat->pins[pin].gpio.pinmap, 1);

    return MRAA_SUCCESS;
}